

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O2

c_v256 * c_v256_unpackhi_s16_s32(c_v256 a)

{
  c_v256 *in_RDI;
  c_v128 cVar1;
  c_v128 cVar2;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  
  cVar1.u64[1] = in_stack_00000020;
  cVar1.u64[0] = (uint64_t)in_RDI;
  cVar1 = c_v128_unpackhi_s16_s32(cVar1);
  cVar2.u64[1] = in_stack_00000020;
  cVar2.u64[0] = in_stack_00000018;
  cVar2 = c_v128_unpacklo_s16_s32(cVar2);
  in_RDI->v128[1] = cVar1;
  in_RDI->v128[0] = cVar2;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_unpackhi_s16_s32(c_v256 a) {
  return c_v256_from_v128(c_v128_unpackhi_s16_s32(a.v128[1]),
                          c_v128_unpacklo_s16_s32(a.v128[1]));
}